

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

DWORD GetModuleFileNameA(HMODULE hModule,LPSTR lpFileName,DWORD nSize)

{
  BOOL BVar1;
  DWORD DVar2;
  LPWSTR *ppWVar3;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001cecb2;
  LockModuleList();
  if (hModule == (HMODULE)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cecb2;
    ppWVar3 = &exe_module.lib_name;
LAB_001cec02:
    if (*ppWVar3 == (LPCWSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","GetModuleFileNameA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
              ,0x1d4);
      fprintf(_stderr,"Can\'t find name for valid module handle %p\n",hModule);
      DVar2 = 0x54f;
      goto LAB_001cec90;
    }
    DVar2 = WideCharToMultiByte(0,0,*ppWVar3,-1,lpFileName,nSize,(LPCSTR)0x0,(LPBOOL)0x0);
    if (DVar2 == 0) {
      DVar2 = 0x7a;
      goto joined_r0x001cec8e;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cecb2;
  }
  else {
    BVar1 = LOADValidateModule((MODSTRUCT *)hModule);
    if (BVar1 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cecb2;
      ppWVar3 = (LPWSTR *)((long)hModule + 0x18);
      goto LAB_001cec02;
    }
    DVar2 = 6;
joined_r0x001cec8e:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cecb2;
LAB_001cec90:
    SetLastError(DVar2);
    DVar2 = 0;
  }
  UnlockModuleList();
  if (PAL_InitializeChakraCoreCalled != false) {
    return DVar2;
  }
LAB_001cecb2:
  abort();
}

Assistant:

DWORD
PALAPI
GetModuleFileNameA(
    IN HMODULE hModule,
    OUT LPSTR lpFileName,
    IN DWORD nSize)
{
    INT name_length;
    DWORD retval = 0;
    LPWSTR wide_name = nullptr;

    PERF_ENTRY(GetModuleFileNameA);
    ENTRY("GetModuleFileNameA (hModule=%p, lpFileName=%p, nSize=%u)\n",
          hModule, lpFileName, nSize);

    LockModuleList();
    if (hModule && !LOADValidateModule((MODSTRUCT *)hModule))
    {
        TRACE("Can't find name for invalid module handle %p\n", hModule);
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }
    wide_name = LOADGetModuleFileName((MODSTRUCT *)hModule);

    if (!wide_name)
    {
        ASSERT("Can't find name for valid module handle %p\n", hModule);
        SetLastError(ERROR_INTERNAL_ERROR);
        goto done;
    }

    /* Convert module name to Ascii, place it in the supplied buffer */

    name_length = WideCharToMultiByte(CP_ACP, 0, wide_name, -1, lpFileName,
                                      nSize, nullptr, nullptr);
    if (name_length == 0)
    {
        TRACE("Buffer too small to copy module's file name.\n");
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        goto done;
    }

    TRACE("File name of module %p is %s\n", hModule, lpFileName);
    retval = name_length;
done:
    UnlockModuleList();
    LOGEXIT("GetModuleFileNameA returns DWORD %d\n", retval);
    PERF_EXIT(GetModuleFileNameA);
    return retval;
}